

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

ion_bpp_err_t flushAll(ion_bpp_handle_t handle)

{
  ion_bpp_err_t in_EAX;
  undefined8 *puVar1;
  
  if ((*(int *)((long)handle + 0x44) != 0) &&
     (in_EAX = flush(*handle,(ion_bpp_buffer_t *)(ulong)*(uint *)((long)handle + 0x10)),
     in_EAX != bErrOk)) {
    return in_EAX;
  }
  puVar1 = *(undefined8 **)((long)handle + 0x48);
  while( true ) {
    if (puVar1 == (undefined8 *)((long)handle + 0x48)) {
      return in_EAX;
    }
    if ((*(int *)((long)puVar1 + 0x24) != 0) &&
       (in_EAX = flush(*handle,(ion_bpp_buffer_t *)(ulong)*(uint *)((long)handle + 0x10)),
       in_EAX != bErrOk)) break;
    puVar1 = (undefined8 *)*puVar1;
  }
  return in_EAX;
}

Assistant:

static ion_bpp_err_t
flushAll(
	ion_bpp_handle_t handle
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*buf;				/* buffer */

	if (h->root.modified) {
		if ((rc = flush(handle, &h->root)) != 0) {
			return rc;
		}
	}

	buf = h->bufList.next;

	while (buf != &h->bufList) {
		if (buf->modified) {
			if ((rc = flush(handle, buf)) != 0) {
				return rc;
			}
		}

		buf = buf->next;
	}

	return bErrOk;
}